

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall
helics::apps::WebServer::mainLoop(WebServer *this,shared_ptr<helics::apps::WebServer> *keepAlive)

{
  bool bVar1;
  byte bVar2;
  long in_RDI;
  address address_1;
  bool external_1;
  bool ipv6_1;
  bool ipv4_1;
  value_type *webConfig;
  int websocketInterfaceNetwork;
  address address;
  bool external;
  bool ipv6;
  bool ipv4;
  value_type *httpConfig;
  int httpInterfaceNetwork;
  string *in_stack_fffffffffffffbc8;
  address *addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  basic_endpoint<boost::asio::ip::tcp> *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  byte in_stack_fffffffffffffbff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  io_context *in_stack_fffffffffffffc08;
  undefined5 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc15;
  char in_stack_fffffffffffffc16;
  undefined1 in_stack_fffffffffffffc17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc70;
  InterfaceNetworks network;
  string *in_stack_fffffffffffffc78;
  char local_352;
  undefined1 local_2f4 [44];
  address local_2c8 [2];
  allocator<char> local_281 [40];
  io_context local_259 [2];
  byte local_232;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_231;
  byte local_20a;
  allocator<char> local_209 [39];
  byte local_1e2;
  allocator<char> local_1e1 [40];
  allocator<char> local_1b9 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  int local_190;
  undefined1 local_18c [28];
  string local_170 [2];
  allocator<char> local_119 [40];
  allocator<char> local_f1 [39];
  byte local_ca;
  allocator<char> local_c9 [39];
  undefined1 local_a2;
  allocator<char> local_a1 [39];
  byte local_7a;
  allocator<char> local_79 [56];
  allocator<char> local_41 [33];
  const_reference local_20;
  int local_14;
  
  network = (InterfaceNetworks)((ulong)in_stack_fffffffffffffc70 >> 0x38);
  if ((*(byte *)(in_RDI + 0xe4) & 1) != 0) {
    local_14 = *(int *)(in_RDI + 0xe8);
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[5],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffbf0,(char (*) [5])in_stack_fffffffffffffbe8);
    if (bVar1) {
      local_20 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      fileops::replaceIfMember
                ((json *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      fileops::replaceIfMember
                ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(int *)0x1fee14);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      bVar1 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,false);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_a1);
      if (bVar1) {
        local_14 = 4;
      }
      local_7a = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      bVar1 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,false);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_c9);
      if (bVar1) {
        local_352 = '\n';
        if ((local_7a & 1) == 0) {
          local_352 = '\x06';
        }
        local_14 = (int)local_352;
      }
      local_a2 = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      bVar1 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,false);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_f1);
      local_ca = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      fileops::replaceIfMember
                ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(bool *)0x1ff1c6);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_119);
      if ((local_ca & 1) != 0) {
        local_14 = 10;
      }
    }
    gmlc::networking::generateMatchingInterfaceAddress(in_stack_fffffffffffffc78,network);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
    gmlc::networking::removeProtocol((string *)in_stack_fffffffffffffbd0);
    bVar1 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    }
    boost::asio::ip::make_address(in_stack_fffffffffffffbd8);
    CLI::std::
    __shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ff368);
    network = (InterfaceNetworks)((ulong)local_18c >> 0x38);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)in_stack_fffffffffffffbd0,
               (address *)in_stack_fffffffffffffbc8,0);
    in_stack_fffffffffffffc78 = local_170;
    std::
    make_shared<Listener,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
              ((io_context *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               in_stack_fffffffffffffbf0);
    CLI::std::__shared_ptr_access<Listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Listener,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ff3d1);
    Listener::run((Listener *)0x1ff3d9);
    CLI::std::shared_ptr<Listener>::~shared_ptr((shared_ptr<Listener> *)0x1ff3e8);
  }
  if ((*(byte *)(in_RDI + 0xe5) & 1) != 0) {
    local_190 = *(int *)(in_RDI + 0xe8);
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[10],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffbf0,(char (*) [10])in_stack_fffffffffffffbe8);
    if (bVar1) {
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      fileops::replaceIfMember
                ((json *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_1b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      fileops::replaceIfMember
                ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(int *)0x1ff557);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_1e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      bVar1 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,false);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_209);
      if (bVar1) {
        local_190 = 4;
      }
      in_stack_fffffffffffffc20 = &local_231;
      in_stack_fffffffffffffc18 = local_198;
      local_1e2 = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      bVar2 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,false);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      local_20a = bVar2 & 1;
      if (local_20a != 0) {
        in_stack_fffffffffffffc15 = 6;
        in_stack_fffffffffffffc16 = '\n';
        if ((local_1e2 & 1) == 0) {
          in_stack_fffffffffffffc16 = '\x06';
        }
        local_190 = (int)in_stack_fffffffffffffc16;
      }
      in_stack_fffffffffffffc08 = local_259;
      in_stack_fffffffffffffc00 = local_198;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      in_stack_fffffffffffffbff =
           fileops::getOrDefault((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,false);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator((allocator<char> *)local_259);
      local_232 = in_stack_fffffffffffffbff & 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                 (char *)in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
      fileops::replaceIfMember
                ((json *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(bool *)0x1ff8b4);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::allocator<char>::~allocator(local_281);
      if ((local_232 & 1) != 0) {
        local_190 = 10;
      }
    }
    gmlc::networking::generateMatchingInterfaceAddress(in_stack_fffffffffffffc78,network);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
    gmlc::networking::removeProtocol((string *)in_stack_fffffffffffffbd0);
    bVar1 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    }
    addr = local_2c8;
    boost::asio::ip::make_address(in_stack_fffffffffffffbd8);
    in_stack_fffffffffffffbd0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         __shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1ffa52);
    in_stack_fffffffffffffbd8 = (string *)local_2f4;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)in_stack_fffffffffffffbd0,addr,0);
    in_stack_fffffffffffffbe0 = (string *)(local_2f4 + 0x1c);
    std::
    make_shared<Listener,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,bool>
              (in_stack_fffffffffffffc08,
               (basic_endpoint<boost::asio::ip::tcp> *)in_stack_fffffffffffffc00,
               (bool *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
    CLI::std::__shared_ptr_access<Listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Listener,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ffab5);
    Listener::run((Listener *)0x1ffabd);
    CLI::std::shared_ptr<Listener>::~shared_ptr((shared_ptr<Listener> *)0x1ffacc);
  }
  CLI::std::atomic<bool>::store
            ((atomic<bool> *)in_stack_fffffffffffffbd8,
             SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0),
             (memory_order)in_stack_fffffffffffffbd0);
  bVar1 = CLI::std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_fffffffffffffbd8,
                     (memory_order)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
  if (bVar1) {
    CLI::std::
    __shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ffb3f);
    boost::asio::io_context::run((io_context *)in_stack_fffffffffffffbe0);
  }
  CLI::std::atomic<bool>::store
            ((atomic<bool> *)in_stack_fffffffffffffbd8,
             SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0),
             (memory_order)in_stack_fffffffffffffbd0);
  CLI::std::__shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_fffffffffffffbe0);
  return;
}

Assistant:

void WebServer::mainLoop(std::shared_ptr<WebServer> keepAlive)
{
    if (mHttpEnabled) {
        auto httpInterfaceNetwork = mInterfaceNetwork;
        if (config->contains("http")) {
            const auto& httpConfig = (*config)["http"];
            helics::fileops::replaceIfMember(httpConfig, "interface", mHttpAddress);
            helics::fileops::replaceIfMember(httpConfig, "port", mHttpPort);
            const bool ipv4 = helics::fileops::getOrDefault(httpConfig, "ipv4", false);

            if (ipv4) {
                httpInterfaceNetwork = static_cast<int>(gmlc::networking::InterfaceNetworks::IPV4);
            }
            const bool ipv6 = helics::fileops::getOrDefault(httpConfig, "ipv6", false);
            if (ipv6) {
                httpInterfaceNetwork =
                    static_cast<int>((ipv4) ? gmlc::networking::InterfaceNetworks::ALL :
                                              gmlc::networking::InterfaceNetworks::IPV6);
            }

            bool external = helics::fileops::getOrDefault(httpConfig, "external", false);
            helics::fileops::replaceIfMember(httpConfig, "all", external);
            if (external) {
                httpInterfaceNetwork = static_cast<int>(gmlc::networking::InterfaceNetworks::ALL);
            }
        }
        mHttpAddress = gmlc::networking::generateMatchingInterfaceAddress(
            mHttpAddress, static_cast<gmlc::networking::InterfaceNetworks>(httpInterfaceNetwork));
        gmlc::networking::removeProtocol(mHttpAddress);
        if (mHttpAddress == "*") {
            mHttpAddress = "0.0.0.0";
        }
        auto const address = net::ip::make_address(mHttpAddress);
        // Create and launch a listening port
        std::make_shared<Listener>(context->ioc,
                                   tcp::endpoint{address, static_cast<std::uint16_t>(mHttpPort)})
            ->run();
    }

    if (mWebsocketEnabled) {
        auto websocketInterfaceNetwork = mInterfaceNetwork;
        if (config->contains("websocket")) {
            const auto& webConfig = (*config)["websocket"];
            helics::fileops::replaceIfMember(webConfig, "interface", mWebsocketAddress);
            helics::fileops::replaceIfMember(webConfig, "port", mWebsocketPort);

            const bool ipv4 = helics::fileops::getOrDefault(webConfig, "ipv4", false);

            if (ipv4) {
                websocketInterfaceNetwork =
                    static_cast<int>(gmlc::networking::InterfaceNetworks::IPV4);
            }
            const bool ipv6 = helics::fileops::getOrDefault(webConfig, "ipv6", false);
            if (ipv6) {
                websocketInterfaceNetwork =
                    static_cast<int>((ipv4) ? gmlc::networking::InterfaceNetworks::ALL :
                                              gmlc::networking::InterfaceNetworks::IPV6);
            }

            bool external = helics::fileops::getOrDefault(webConfig, "external", false);
            helics::fileops::replaceIfMember(webConfig, "all", external);
            if (external) {
                websocketInterfaceNetwork =
                    static_cast<int>(gmlc::networking::InterfaceNetworks::ALL);
            }
        }
        mWebsocketAddress = gmlc::networking::generateMatchingInterfaceAddress(
            mWebsocketAddress,
            static_cast<gmlc::networking::InterfaceNetworks>(websocketInterfaceNetwork));
        gmlc::networking::removeProtocol(mWebsocketAddress);
        if (mWebsocketAddress == "*") {
            mWebsocketAddress = "0.0.0.0";
        }
        auto const address = net::ip::make_address(mWebsocketAddress);
        // Create and launch a listening port
        std::make_shared<Listener>(context->ioc,
                                   tcp::endpoint{address,
                                                 static_cast<std::uint16_t>(mWebsocketPort)},
                                   true)
            ->run();
    }
    executing.store(true);
    // Run the I/O service
    if (running.load()) {
        context->ioc.run();
    }
    executing.store(false);
    keepAlive.reset();
}